

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred.c
# Opt level: O2

void ihevc_weighted_pred_bi
               (WORD16 *pi2_src1,WORD16 *pi2_src2,UWORD8 *pu1_dst,WORD32 src_strd1,WORD32 src_strd2,
               WORD32 dst_strd,WORD32 wgt0,WORD32 off0,WORD32 wgt1,WORD32 off1,WORD32 shift,
               WORD32 lvl_shift1,WORD32 lvl_shift2,WORD32 ht,WORD32 wd)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  
  uVar4 = 0;
  if (wd < 1) {
    wd = uVar4;
  }
  if (ht < 1) {
    ht = uVar4;
  }
  for (; uVar4 != ht; uVar4 = uVar4 + 1) {
    for (uVar2 = 0; (uint)wd != uVar2; uVar2 = uVar2 + 1) {
      iVar3 = (pi2_src2[uVar2] + lvl_shift2) * wgt1 +
              (pi2_src1[uVar2] + lvl_shift1) * wgt0 + (off0 + off1 + 1 << ((byte)shift - 1 & 0x1f));
      bVar1 = (byte)shift & 0x1f;
      if (iVar3 >> bVar1 < 1) {
        iVar3 = 0;
      }
      iVar3 = iVar3 >> bVar1;
      if (0xfe < iVar3) {
        iVar3 = 0xff;
      }
      pu1_dst[uVar2] = (UWORD8)iVar3;
    }
    pu1_dst = pu1_dst + dst_strd;
    pi2_src2 = pi2_src2 + src_strd2;
    pi2_src1 = pi2_src1 + src_strd1;
  }
  return;
}

Assistant:

void ihevc_weighted_pred_bi(WORD16 *pi2_src1,
                            WORD16 *pi2_src2,
                            UWORD8 *pu1_dst,
                            WORD32 src_strd1,
                            WORD32 src_strd2,
                            WORD32 dst_strd,
                            WORD32 wgt0,
                            WORD32 off0,
                            WORD32 wgt1,
                            WORD32 off1,
                            WORD32 shift,
                            WORD32 lvl_shift1,
                            WORD32 lvl_shift2,
                            WORD32 ht,
                            WORD32 wd)
{
    WORD32 row, col;
    WORD32 i4_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            i4_tmp = (pi2_src1[col] + lvl_shift1) * wgt0;
            i4_tmp += (pi2_src2[col] + lvl_shift2) * wgt1;
            i4_tmp += (off0 + off1 + 1) << (shift - 1);

            pu1_dst[col] = CLIP_U8(i4_tmp >> shift);
        }

        pi2_src1 += src_strd1;
        pi2_src2 += src_strd2;
        pu1_dst += dst_strd;
    }
}